

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O0

void vkt::api::anon_unknown_0::addImageToImageAllFormatsDepthStencilFormatsTests
               (TestCaseGroup *group,TestParams *params)

{
  CopyImageToImageTestCase *this;
  TestContext *testCtx;
  VkImageLayout layout;
  VkImageLayout layout_00;
  VkImageLayout layout_01;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  TestParams local_1b0;
  string local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  string description;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string testName;
  int dstLayoutNdx;
  int srcLayoutNdx;
  VkImageLayout copyDstLayouts [2];
  VkImageLayout copySrcLayouts [2];
  TestParams *params_local;
  TestCaseGroup *group_local;
  
  copyDstLayouts[0] = VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
  copyDstLayouts[1] = VK_IMAGE_LAYOUT_GENERAL;
  _dstLayoutNdx = 0x100000007;
  for (testName.field_2._12_4_ = 0; (int)testName.field_2._12_4_ < 2;
      testName.field_2._12_4_ = testName.field_2._12_4_ + 1) {
    (params->src).image.operationLayout = copyDstLayouts[(int)testName.field_2._12_4_];
    for (testName.field_2._8_4_ = 0; (int)testName.field_2._8_4_ < 2;
        testName.field_2._8_4_ = testName.field_2._8_4_ + 1) {
      (params->dst).image.operationLayout = (&dstLayoutNdx)[(int)testName.field_2._8_4_];
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_90,(_anonymous_namespace_ *)(ulong)(params->src).image.operationLayout,
                 (VkImageLayout)in_RDX);
      std::operator+(&local_70,&local_90,"_");
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                ((string *)((long)&description.field_2 + 8),
                 (_anonymous_namespace_ *)(ulong)(params->dst).image.operationLayout,layout);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     &local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&description.field_2 + 8));
      std::__cxx11::string::~string((string *)(description.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_140,(_anonymous_namespace_ *)(ulong)(params->src).image.operationLayout,
                 layout_00);
      std::operator+(&local_120,"From layout ",&local_140);
      std::operator+(&local_100,&local_120," to ");
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_160,(_anonymous_namespace_ *)(ulong)(params->dst).image.operationLayout,
                 layout_01);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     &local_100,&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      this = (CopyImageToImageTestCase *)operator_new(0xc0);
      testCtx = tcu::TestNode::getTestContext(&group->super_TestNode);
      TestParams::TestParams(&local_1b0,params);
      CopyImageToImageTestCase::CopyImageToImageTestCase
                (this,testCtx,(string *)local_50,(string *)local_e0,&local_1b0);
      tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)this);
      TestParams::~TestParams(&local_1b0);
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::~string((string *)local_50);
      in_RDX = extraout_RDX;
    }
  }
  return;
}

Assistant:

void addImageToImageAllFormatsDepthStencilFormatsTests (tcu::TestCaseGroup* group, TestParams params)
{
	const VkImageLayout copySrcLayouts[]		=
	{
		VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
		VK_IMAGE_LAYOUT_GENERAL
	};
	const VkImageLayout copyDstLayouts[]		=
	{
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
		VK_IMAGE_LAYOUT_GENERAL
	};

	for (int srcLayoutNdx = 0u; srcLayoutNdx < DE_LENGTH_OF_ARRAY(copySrcLayouts); ++srcLayoutNdx)
	{
		params.src.image.operationLayout = copySrcLayouts[srcLayoutNdx];
		for (int dstLayoutNdx = 0u; dstLayoutNdx < DE_LENGTH_OF_ARRAY(copyDstLayouts); ++dstLayoutNdx)
		{
			params.dst.image.operationLayout = copyDstLayouts[dstLayoutNdx];

			const std::string testName		= getImageLayoutCaseName(params.src.image.operationLayout) + "_" +
											  getImageLayoutCaseName(params.dst.image.operationLayout);
			const std::string description	= "From layout " + getImageLayoutCaseName(params.src.image.operationLayout) +
											  " to " + getImageLayoutCaseName(params.dst.image.operationLayout);
			group->addChild(new CopyImageToImageTestCase(group->getTestContext(), testName, description, params));
		}
	}
}